

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

TopLevelEvalFunctionBodyResolveInfo * __thiscall
TTD::EventLog::AddEvalFunction
          (EventLog *this,FunctionBody *fb,ModuleID moduleId,char16 *source,uint32 sourceLen,
          uint32 grfscr,bool registerDocument,BOOL isIndirect,BOOL strictMode)

{
  uint32 uVar1;
  uint32 uVar2;
  uint uVar3;
  Utf8SourceInfo *this_00;
  uint *puVar4;
  uint local_58;
  uint32 local_54;
  TopLevelEvalFunctionBodyResolveInfo *pTStack_50;
  uint32 fCount;
  TopLevelEvalFunctionBodyResolveInfo *fbInfo;
  uint32 local_40;
  uint32 uStack_3c;
  bool registerDocument_local;
  uint32 grfscr_local;
  uint32 sourceLen_local;
  char16 *source_local;
  FunctionBody *pFStack_28;
  ModuleID moduleId_local;
  FunctionBody *fb_local;
  EventLog *this_local;
  
  fbInfo._7_1_ = registerDocument;
  local_40 = grfscr;
  uStack_3c = sourceLen;
  _grfscr_local = source;
  source_local._4_4_ = moduleId;
  pFStack_28 = fb;
  fb_local = (FunctionBody *)this;
  pTStack_50 = UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL>::
               NextOpenEntry(&this->m_evalTopLevelScripts);
  uVar1 = UnorderedArrayList<TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo,_512UL>::
          Count(&this->m_loadedTopLevelScripts);
  uVar2 = UnorderedArrayList<TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo,_128UL>::Count
                    (&this->m_newFunctionTopLevelScripts);
  local_54 = UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL>::
             Count(&this->m_evalTopLevelScripts);
  local_54 = uVar1 + uVar2 + local_54;
  NSSnapValues::ExtractTopLevelEvalFunctionBodyInfo
            (pTStack_50,pFStack_28,local_54,source_local._4_4_,_grfscr_local,uStack_3c,local_40,
             (bool)(fbInfo._7_1_ & 1),isIndirect,strictMode,&this->m_miscSlabAllocator);
  this_00 = Js::FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)pFStack_28);
  uVar3 = Js::Utf8SourceInfo::GetSourceInfoId(this_00);
  local_58 = uVar3 + 1;
  puVar4 = max<unsigned_int>(&this->m_sourceInfoCount,&local_58);
  this->m_sourceInfoCount = *puVar4;
  return pTStack_50;
}

Assistant:

const NSSnapValues::TopLevelEvalFunctionBodyResolveInfo* EventLog::AddEvalFunction(Js::FunctionBody* fb, Js::ModuleID moduleId, const char16* source, uint32 sourceLen, uint32 grfscr, bool registerDocument, BOOL isIndirect, BOOL strictMode)
    {
        NSSnapValues::TopLevelEvalFunctionBodyResolveInfo* fbInfo = this->m_evalTopLevelScripts.NextOpenEntry();
        uint32 fCount = (this->m_loadedTopLevelScripts.Count() + this->m_newFunctionTopLevelScripts.Count() + this->m_evalTopLevelScripts.Count());

        NSSnapValues::ExtractTopLevelEvalFunctionBodyInfo(fbInfo, fb, fCount, moduleId, source, sourceLen, grfscr, registerDocument, isIndirect, strictMode, this->m_miscSlabAllocator);
        this->m_sourceInfoCount = max(this->m_sourceInfoCount, fb->GetUtf8SourceInfo()->GetSourceInfoId() + 1);

        return fbInfo;
    }